

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::processingQualifier(CScanner *this,char c)

{
  bool bVar1;
  
  bVar1 = IsWordLetter(c);
  if (bVar1) {
    std::__cxx11::string::push_back((char)this + -0x50);
    return;
  }
  if (c == ':') {
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_Qualifier;
    CParser::AddToken(&this->super_CParser);
    this->state = S_Initial;
    return;
  }
  error(this,E_UnclosedQualifier,c);
  this->state = S_Initial;
  processing(this,c);
  return;
}

Assistant:

void CScanner::processingQualifier( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else if( c == LimiterOfQualifier ) {
		addToken( TT_Qualifier );
		state = S_Initial;
	} else {
		error( E_UnclosedQualifier, c );
		state = S_Initial;
		processing( c );
	}
}